

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

Element * __thiscall
Rml::Context::GetElementAtPoint
          (Context *this,Vector2f point,Element *ignore_element,Element *element)

{
  bool bVar1;
  int iVar2;
  Element *this_00;
  ElementDocument *pEVar3;
  Element *pEVar4;
  undefined7 extraout_var;
  ComputedValues *pCVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  Rectanglei clip_region;
  Vector2f local_70;
  undefined8 local_68;
  Element *local_60;
  Rectanglei local_58;
  ElementDocument *local_40;
  Context *local_38;
  
  if ((element != (Element *)0x0) ||
     (element = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl, element != ignore_element
     )) {
    local_70 = point;
    if ((element ==
         (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl) &&
       ((this->focus != (Element *)0x0 &&
        (pEVar3 = Element::GetOwnerDocument(this->focus), pEVar3 != (ElementDocument *)0x0)))) {
      bVar1 = ElementDocument::IsModal(pEVar3);
      local_68 = CONCAT71(extraout_var,bVar1);
    }
    else {
      pEVar3 = (ElementDocument *)0x0;
      local_68 = 0;
    }
    if (element->local_stacking_context == true) {
      local_40 = pEVar3;
      if (element->stacking_context_dirty == true) {
        Element::BuildLocalStackingContext(element);
      }
      uVar6 = (uint)((ulong)((long)(element->stacking_context).
                                   super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            *(long *)&(element->stacking_context).
                                      super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                      ._M_impl.super__Vector_impl_data) >> 3);
      bVar1 = (int)uVar6 < 1;
      if (0 < (int)uVar6) {
        uVar7 = (ulong)(uVar6 & 0x7fffffff);
        local_38 = this;
        do {
          pEVar4 = *(Element **)
                    (*(long *)&(element->stacking_context).
                               super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                               _M_impl.super__Vector_impl_data + -8 + uVar7 * 8);
          if (ignore_element == (Element *)0x0) {
LAB_001eb3f9:
            if ((char)local_68 != '\0') {
              pEVar3 = Element::GetOwnerDocument(pEVar4);
              if ((pEVar3 == (ElementDocument *)0x0) ||
                 ((pEVar3 != local_40 &&
                  (bVar9 = ElementDocument::IsFocusableFromModal(pEVar3), !bVar9)))) {
                bVar9 = false;
              }
              else {
                bVar9 = true;
              }
              bVar10 = false;
              if (!bVar9) goto LAB_001eb468;
            }
            pEVar4 = GetElementAtPoint(local_38,local_70,ignore_element,pEVar4);
            bVar10 = pEVar4 != (Element *)0x0;
            if (bVar10) {
              local_60 = pEVar4;
            }
          }
          else {
            bVar9 = pEVar4 == (Element *)0x0;
            this_00 = pEVar4;
            if (pEVar4 != ignore_element && !bVar9) {
              do {
                this_00 = Element::GetParentNode(this_00);
                bVar9 = this_00 == (Element *)0x0;
                if (bVar9) break;
              } while (this_00 != ignore_element);
            }
            if (bVar9) goto LAB_001eb3f9;
            bVar10 = false;
          }
LAB_001eb468:
          if (bVar10) break;
          bVar1 = (long)uVar7 < 2;
          bVar9 = 1 < (long)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar9);
      }
      if (!bVar1) {
        return local_60;
      }
    }
    pCVar5 = Element::GetComputedValues(element);
    if (((pCVar5->inherited).field_0x15 & 0x20) != 0) {
      bVar1 = Element::Project(element,&local_70);
      if (bVar1) {
        iVar2 = (*(element->super_ScriptInterface).super_Releasable._vptr_Releasable[7])
                          (local_70.x,element);
        cVar8 = (char)iVar2;
      }
      else {
        cVar8 = '\0';
      }
      if (cVar8 != '\0') {
        local_58.p0.x = 0;
        local_58.p0.y = 0;
        local_58.p1.x = 0;
        local_58.p1.y = 0;
        bVar1 = ElementUtilities::GetClippingRegion
                          (element,&local_58,(ClipMaskGeometryList *)0x0,false);
        if (bVar1) {
          cVar8 = '\0';
          if ((local_58.p0.x <= (int)local_70.x) && (cVar8 = '\0', (int)local_70.x <= local_58.p1.x)
             ) {
            if (local_58.p0.y <= (int)local_70.y) {
              cVar8 = (int)local_70.y <= local_58.p1.y;
            }
          }
        }
      }
      if (cVar8 == '\0') {
        return (Element *)0x0;
      }
      return element;
    }
  }
  return (Element *)0x0;
}

Assistant:

Element* Context::GetElementAtPoint(Vector2f point, const Element* ignore_element, Element* element) const
{
	if (!element)
	{
		if (ignore_element == root.get())
			return nullptr;

		element = root.get();
	}

	bool is_modal = false;
	ElementDocument* focus_document = nullptr;

	// If we have modal focus, only check down documents that can receive focus from modals.
	if (element == root.get() && focus)
	{
		focus_document = focus->GetOwnerDocument();
		if (focus_document && focus_document->IsModal())
			is_modal = true;
	}

	// Check any elements within our stacking context. We want to return the lowest-down element
	// that is under the cursor.
	if (element->local_stacking_context)
	{
		if (element->stacking_context_dirty)
			element->BuildLocalStackingContext();

		for (int i = (int)element->stacking_context.size() - 1; i >= 0; --i)
		{
			Element* stacking_child = element->stacking_context[i];
			if (ignore_element)
			{
				// Check if the element is a descendant of the element we're ignoring.
				Element* element_hierarchy = stacking_child;
				while (element_hierarchy)
				{
					if (element_hierarchy == ignore_element)
						break;

					element_hierarchy = element_hierarchy->GetParentNode();
				}

				if (element_hierarchy)
					continue;
			}

			if (is_modal)
			{
				ElementDocument* child_document = stacking_child->GetOwnerDocument();
				if (!child_document || !(child_document == focus_document || child_document->IsFocusableFromModal()))
					continue;
			}

			Element* child_element = GetElementAtPoint(point, ignore_element, stacking_child);
			if (child_element)
				return child_element;
		}
	}

	// Ignore elements whose pointer events are disabled.
	if (element->GetComputedValues().pointer_events() == Style::PointerEvents::None)
		return nullptr;

	// Projection may fail if we have a singular transformation matrix.
	bool projection_result = element->Project(point);

	// Check if the point is actually within this element.
	bool within_element = (projection_result && element->IsPointWithinElement(point));
	if (within_element)
	{
		// The element may have been clipped out of view if it overflows an ancestor, so check its clipping region.
		Rectanglei clip_region;
		if (ElementUtilities::GetClippingRegion(element, clip_region))
			within_element = clip_region.Contains(Vector2i(point));
	}

	if (within_element)
		return element;

	return nullptr;
}